

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O1

curl_header * curl_easy_nextheader(CURL_conflict *easy,uint type,int request,curl_header *prev)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  curl_header *h;
  Curl_llist *pCVar4;
  size_t sVar5;
  Curl_llist_element *pCVar6;
  size_t sVar7;
  int iVar8;
  Curl_llist_element *pCVar9;
  
  iVar8 = (easy->state).requests;
  if (request <= iVar8) {
    if (request != -1) {
      iVar8 = request;
    }
    if (prev == (curl_header *)0x0) {
      pCVar4 = &(easy->state).httphdrs;
    }
    else {
      if (prev->anchor == (void *)0x0) {
        return (curl_header *)0x0;
      }
      pCVar4 = (Curl_llist *)((long)prev->anchor + 0x10);
    }
    for (pCVar9 = pCVar4->head; pCVar9 != (Curl_llist_element *)0x0; pCVar9 = pCVar9->next) {
      if (((*(byte *)((long)pCVar9->ptr + 0x2c) & type) != 0) &&
         (*(int *)((long)pCVar9->ptr + 0x28) == iVar8)) goto LAB_006a283b;
    }
    pCVar9 = (Curl_llist_element *)0x0;
LAB_006a283b:
    if (pCVar9 != (Curl_llist_element *)0x0) {
      pvVar1 = pCVar9->ptr;
      pCVar6 = (easy->state).httphdrs.head;
      if (pCVar6 == (Curl_llist_element *)0x0) {
        sVar5 = 0;
        sVar7 = 0;
      }
      else {
        sVar7 = 0;
        sVar5 = 0;
        do {
          pvVar2 = pCVar6->ptr;
          iVar3 = curl_strequal(*(char **)((long)pvVar1 + 0x18),*(char **)((long)pvVar2 + 0x18));
          if ((iVar3 != 0) && (*(int *)((long)pvVar2 + 0x28) == iVar8)) {
            sVar5 = (sVar5 + 1) - (ulong)((*(byte *)((long)pvVar2 + 0x2c) & type) == 0);
          }
          if (pCVar6 == pCVar9) {
            sVar7 = sVar5 - 1;
          }
          pCVar6 = pCVar6->next;
        } while (pCVar6 != (Curl_llist_element *)0x0);
      }
      (easy->state).headerout[1].name = *(char **)((long)pvVar1 + 0x18);
      (easy->state).headerout[1].value = *(char **)((long)pvVar1 + 0x20);
      (easy->state).headerout[1].amount = sVar5;
      (easy->state).headerout[1].index = sVar7;
      (easy->state).headerout[1].origin = *(byte *)((long)pvVar1 + 0x2c) | 0x8000000;
      (easy->state).headerout[1].anchor = pCVar9;
      return (easy->state).headerout + 1;
    }
  }
  return (curl_header *)0x0;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_element *pick;
  struct Curl_llist_element *e;
  struct Curl_header_store *hs;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = pick->next;
  }
  else
    pick = data->state.httphdrs.head;

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = pick->ptr;
      if((hs->type & type) && (hs->request == request))
        break;
      pick = pick->next;
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = pick->ptr;

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    struct Curl_header_store *check = e->ptr;
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(hs, index, amount, pick,
                       &data->state.headerout[1]);
  return &data->state.headerout[1];
}